

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::DrawGridTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DrawGridTestInstance *this)

{
  DeviceDriver *vkd;
  Allocation *pAVar1;
  Move<vk::Handle<(vk::HandleType)24>_> local_e8;
  VkCommandPool local_c8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_c0;
  VkBufferCopy copyRegions [2];
  Move<vk::VkCommandBuffer_s_*> local_78;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_58;
  
  (*(this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
    _vptr_TestInstance[3])(this);
  vkd = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_deviceDriver.
        super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pAVar1 = (this->m_stagingBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (&vkd->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             this->m_stagingBufferSize);
  copyRegions[0].size = this->m_perDrawBufferOffset;
  copyRegions[1].dstOffset =
       copyRegions[0].size << ((this->super_SparseBufferTestInstance).m_residency & 0x3fU);
  copyRegions[0].dstOffset = copyRegions[1].dstOffset + copyRegions[0].size;
  if ((this->super_SparseBufferTestInstance).m_aliased == false) {
    copyRegions[0].dstOffset = 0;
  }
  copyRegions[0].srcOffset = 0;
  copyRegions[1].srcOffset = copyRegions[0].size;
  copyRegions[1].size = copyRegions[0].size;
  makeCommandPool(&local_e8,&vkd->super_DeviceInterface,
                  (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                  m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                  (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex);
  DStack_c0.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  DStack_c0.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_c8.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  DStack_c0.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            (&local_78,&vkd->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandPool)
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(&vkd->super_DeviceInterface,
                     local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*(vkd->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
            (vkd,local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,
             (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  endCommandBuffer(&vkd->super_DeviceInterface,
                   (VkCommandBuffer)
                   local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal)
  ;
  submitCommandsAndWait
            (&vkd->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).m_universalQueue.queueHandle,
             (VkCommandBuffer)
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,0,
             (VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  if ((VkCommandBuffer)
      local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)
         local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    (*(local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface,
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1)
    ;
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_c0,local_c8);
  }
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  SparseBufferTestInstance::draw
            (&this->super_SparseBufferTestInstance,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
             (VkDescriptorSetLayout)0x0,(SpecializationMap *)&local_58);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_58);
  SparseBufferTestInstance::verifyDrawResult
            (__return_storage_ptr__,&this->super_SparseBufferTestInstance);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		initializeBuffers();

		const DeviceInterface&	vk	= getDeviceInterface();

		// Upload to the sparse buffer
		{
			flushMappedMemoryRange(vk, getDevice(), m_stagingBufferAlloc->getMemory(), m_stagingBufferAlloc->getOffset(), m_stagingBufferSize);

			VkDeviceSize	firstChunkOffset	= 0ull;
			VkDeviceSize	secondChunkOffset	= m_perDrawBufferOffset;

			if (m_residency)
				secondChunkOffset += m_perDrawBufferOffset;

			if (m_aliased)
				firstChunkOffset = secondChunkOffset + m_perDrawBufferOffset;

			const VkBufferCopy copyRegions[] =
			{
				{
					0ull,						// VkDeviceSize    srcOffset;
					firstChunkOffset,			// VkDeviceSize    dstOffset;
					m_perDrawBufferOffset,		// VkDeviceSize    size;
				},
				{
					m_perDrawBufferOffset,		// VkDeviceSize    srcOffset;
					secondChunkOffset,			// VkDeviceSize    dstOffset;
					m_perDrawBufferOffset,		// VkDeviceSize    size;
				},
			};

			const Unique<VkCommandPool>		cmdPool		(makeCommandPool(vk, getDevice(), m_universalQueue.queueFamilyIndex));
			const Unique<VkCommandBuffer>	cmdBuffer	(allocateCommandBuffer(vk, getDevice(), *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

			beginCommandBuffer	(vk, *cmdBuffer);
			vk.cmdCopyBuffer	(*cmdBuffer, *m_stagingBuffer, *m_sparseBuffer, DE_LENGTH_OF_ARRAY(copyRegions), copyRegions);
			endCommandBuffer	(vk, *cmdBuffer);

			submitCommandsAndWait(vk, getDevice(), m_universalQueue.queueHandle, *cmdBuffer);
		}

		draw(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

		return verifyDrawResult();
	}